

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O3

int __thiscall PyreNet::NeuralNet::getOutputSize(NeuralNet *this)

{
  pointer pLVar1;
  int iVar2;
  undefined8 *puVar3;
  
  pLVar1 = (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((0x40 < (ulong)((long)pLVar1 -
                     (long)(this->layers).
                           super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                           _M_impl.super__Vector_impl_data._M_start)) && (this->inputSize != 0)) {
    iVar2 = Layer::size(pLVar1 + -1);
    return iVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_0010cd20;
  __cxa_throw(puVar3,&InvalidNetworkSize::typeinfo,std::exception::~exception);
}

Assistant:

const int NeuralNet::getOutputSize() {
        if (this->layers.size() < 3 || this->inputSize == 0) throw InvalidNetworkSize();
        return this->layers.back().size();
    }